

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

MMAL_FOURCC_T __thiscall
raspicam::_private::Private_Impl_Still::convertEncoding
          (Private_Impl_Still *this,RASPICAM_ENCODING encoding)

{
  RASPICAM_ENCODING encoding_local;
  Private_Impl_Still *this_local;
  MMAL_FOURCC_T local_4;
  
  switch(encoding) {
  case RASPICAM_ENCODING_JPEG:
    local_4 = 0x4745504a;
    break;
  case RASPICAM_ENCODING_BMP:
    local_4 = 0x20504d42;
    break;
  case RASPICAM_ENCODING_GIF:
    local_4 = 0x20464947;
    break;
  case RASPICAM_ENCODING_PNG:
    local_4 = 0x20474e50;
    break;
  case RASPICAM_ENCODING_RGB:
    local_4 = 0x20504d42;
    break;
  default:
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

MMAL_FOURCC_T Private_Impl_Still::convertEncoding ( RASPICAM_ENCODING encoding ) {
            switch ( encoding ) {
            case RASPICAM_ENCODING_JPEG:
                return MMAL_ENCODING_JPEG;
            case RASPICAM_ENCODING_BMP:
                return MMAL_ENCODING_BMP;
            case RASPICAM_ENCODING_GIF:
                return MMAL_ENCODING_GIF;
            case RASPICAM_ENCODING_PNG:
                return MMAL_ENCODING_PNG;
            case RASPICAM_ENCODING_RGB:
                return MMAL_ENCODING_BMP;
            default:
                return -1;
            }
        }